

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O3

LargeRepKind __thiscall google::protobuf::internal::MicroString::large_rep_kind(MicroString *this)

{
  LargeRepKind LVar1;
  LargeRep *pLVar2;
  
  if (((ulong)this->rep_ & 1) != 0) {
    pLVar2 = large_rep(this);
    LVar1 = kOwned;
    if (pLVar2->capacity < kOwned) {
      LVar1 = pLVar2->capacity;
    }
    return LVar1;
  }
  large_rep_kind();
}

Assistant:

LargeRepKind large_rep_kind() const {
    ABSL_DCHECK(is_large_rep());
    size_t cap = large_rep()->capacity;
    return cap >= kOwned ? kOwned : static_cast<LargeRepKind>(cap);
  }